

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O2

Var Js::JavascriptObject::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  Type TVar1;
  ScriptContext *pSVar2;
  JavascriptLibrary *this;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  DynamicObject *pDVar8;
  RecyclableObject *this_00;
  int in_stack_00000010;
  Arguments local_60;
  undefined1 auStack_50 [8];
  ArgumentReader args;
  RecyclableObject *result;
  CallInfo callInfo_local;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  result = (RecyclableObject *)callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0xd,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00b8e1c3;
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)auStack_50,(CallInfo *)&result,(Var *)&stack0x00000018);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  this = (pSVar2->super_ScriptContextBase).javascriptLibrary;
  if ((auStack_50._0_4_ & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x11,"(args.HasArg())","Should always have implicit \'this\'");
    if (!bVar4) goto LAB_00b8e1c3;
    *puVar6 = 0;
  }
  pRVar7 = (RecyclableObject *)Arguments::GetNewTarget((Arguments *)auStack_50);
  local_60.Values = (Type)args.super_Arguments.Info;
  bVar4 = JavascriptOperators::GetAndAssertIsConstructorSuperCall(&local_60);
  if (pRVar7 != function && bVar4) {
    pRVar7 = VarTo<Js::RecyclableObject>(pRVar7);
    pDVar8 = JavascriptLibrary::CreateObject(this,true,0);
    pRVar7 = JavascriptOperators::OrdinaryCreateFromConstructor
                       (pRVar7,&pDVar8->super_RecyclableObject,(DynamicObject *)0x0,pSVar2);
    return pRVar7;
  }
  if ((auStack_50._0_4_ & 0xfffffe) == 0) {
    pRVar7 = (this->super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  else {
    pRVar7 = (RecyclableObject *)Arguments::operator[]((Arguments *)auStack_50,1);
  }
  if (pRVar7 == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00b8e1c3;
    *puVar6 = 0;
  }
  bVar4 = TaggedInt::Is(pRVar7);
  if ((ulong)pRVar7 >> 0x32 == 0 && !bVar4) {
    this_00 = UnsafeVarTo<Js::RecyclableObject>(pRVar7);
    if (this_00 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00b8e1c3;
      *puVar6 = 0;
    }
    TVar1 = ((this_00->type).ptr)->typeId;
    if ((0x57 < (int)TVar1) && (BVar5 = RecyclableObject::IsExternal(this_00), BVar5 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar4) goto LAB_00b8e1c3;
      *puVar6 = 0;
    }
    if ((TVar1 - TypeIds_Function < 0x39) &&
       ((0x10000200000dfc7U >> ((ulong)(TVar1 - TypeIds_Function) & 0x3f) & 1) != 0)) {
      return pRVar7;
    }
    if (TVar1 < TypeIds_Boolean) {
      if (((ulong)result & 0x10000000) != 0) {
        return pRVar7;
      }
      pDVar8 = JavascriptLibrary::CreateObject(this,true,0);
      return pDVar8;
    }
  }
  args.super_Arguments.Values = (Type)0x0;
  JavascriptConversion::ToObject(pRVar7,pSVar2,(RecyclableObject **)&args.super_Arguments.Values);
  if (args.super_Arguments.Values == (Type)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x3c,"(result)","result");
    if (!bVar4) {
LAB_00b8e1c3:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  return args.super_Arguments.Values;
}

Assistant:

Var JavascriptObject::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();
    JavascriptLibrary* library = scriptContext->GetLibrary();

    AssertMsg(args.HasArg(), "Should always have implicit 'this'");

    Var newTarget = args.GetNewTarget();
    if (JavascriptOperators::GetAndAssertIsConstructorSuperCall(args) &&
        newTarget != function)
    {
        return JavascriptOperators::OrdinaryCreateFromConstructor(
            VarTo<RecyclableObject>(newTarget),
            library->CreateObject(true),
            nullptr,
            scriptContext);
    }

    Var arg = args.Info.Count > 1 ? args[1] : library->GetUndefined();
    switch (JavascriptOperators::GetTypeId(arg))
    {
        case TypeIds_Undefined:
        case TypeIds_Null:
            // Null and undefined result in a new object
            return (callInfo.Flags & CallFlags_NotUsed)
                ? arg
                : library->CreateObject(true);

        case TypeIds_StringObject:
        case TypeIds_Function:
        case TypeIds_Array:
        case TypeIds_ES5Array:
        case TypeIds_RegEx:
        case TypeIds_NumberObject:
        case TypeIds_SIMDObject:
        case TypeIds_Date:
        case TypeIds_BooleanObject:
        case TypeIds_Error:
        case TypeIds_Object:
        case TypeIds_Arguments:
        case TypeIds_ActivationObject:
        case TypeIds_SymbolObject:
            // Since we know this is an object, we can skip ToObject
            return arg;
    }

    RecyclableObject* result = nullptr;
    JavascriptConversion::ToObject(arg, scriptContext, &result);
    Assert(result);
    return result;
}